

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

uint __thiscall Js::FunctionBody::GetLoopNumberWithLock(FunctionBody *this,LoopHeader *loopHeader)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  LoopHeader *pLVar4;
  undefined4 *puVar5;
  uint uVar6;
  
  pLVar4 = FunctionProxy::GetAuxPtrWithLock<(Js::FunctionProxy::AuxPointerType)10,Js::LoopHeader*>
                     ((FunctionProxy *)this);
  if (loopHeader < pLVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xff9,"(loopHeader >= loopHeaderArray)",
                                "loopHeader >= loopHeaderArray");
    if (!bVar2) goto LAB_006cee30;
    *puVar5 = 0;
  }
  uVar3 = GetLoopCount(this);
  uVar6 = (uint)(((long)loopHeader - (long)pLVar4) / 0x30);
  if (uVar3 <= uVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xffb,"(loopNum < GetLoopCount())","loopNum < GetLoopCount()");
    if (!bVar2) {
LAB_006cee30:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  return uVar6;
}

Assistant:

uint
    FunctionBody::GetLoopNumberWithLock(LoopHeader const * loopHeader) const
    {
        LoopHeader* loopHeaderArray = this->GetLoopHeaderArrayWithLock();
        Assert(loopHeader >= loopHeaderArray);
        uint loopNum = (uint)(loopHeader - loopHeaderArray);
        Assert(loopNum < GetLoopCount());
        return loopNum;
    }